

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin-ratelimit.hh
# Opt level: O0

void __thiscall
discordpp::
PluginRateLimit<discordpp::PluginInteractionHandler<discordpp::PluginResponder<discordpp::PluginOverload<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>_>_>_>_>
::CountedSet<unsigned_long>::erase(CountedSet<unsigned_long> *this,unsigned_long t,size_t count)

{
  iterator iVar1;
  iterator iVar2;
  bool bVar3;
  pointer ppVar4;
  out_of_range *poVar5;
  _Self local_30;
  _Self local_28;
  iterator entry;
  size_t count_local;
  unsigned_long t_local;
  CountedSet<unsigned_long> *this_local;
  
  if (count != 0) {
    entry._M_node = (_Base_ptr)count;
    count_local = t;
    t_local = (unsigned_long)this;
    local_28._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
         ::find(&this->map,&count_local);
    local_30._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
         ::end(&this->map);
    bVar3 = std::operator==(&local_28,&local_30);
    iVar1 = entry;
    if (bVar3) {
      poVar5 = (out_of_range *)__cxa_allocate_exception(0x10);
      std::out_of_range::out_of_range(poVar5,"Erased a key that doesn\'t exist");
      __cxa_throw(poVar5,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
    ppVar4 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::operator->
                       (&local_28);
    iVar2 = entry;
    if ((_Base_ptr)ppVar4->second < iVar1._M_node) {
      poVar5 = (out_of_range *)__cxa_allocate_exception(0x10);
      std::out_of_range::out_of_range(poVar5,"Erased a key by more than its value");
      __cxa_throw(poVar5,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
    this->sum = this->sum - (long)entry._M_node;
    ppVar4 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::operator->
                       (&local_28);
    ppVar4->second = ppVar4->second - (long)iVar2._M_node;
    ppVar4 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_unsigned_long>_>::operator->
                       (&local_28);
    if (ppVar4->second == 0) {
      std::
      map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
      ::erase(&this->map,&count_local);
    }
  }
  return;
}

Assistant:

void erase(T t, size_t count = 1) {
            if (!count)
                return;

            auto entry = map.find(t);
            if (entry == map.end())
                throw std::out_of_range("Erased a key that doesn't exist");
            if (count > entry->second)
                throw std::out_of_range("Erased a key by more than its value");
            sum -= count;
            entry->second -= count;
            if (entry->second == 0) {
                map.erase(t);
            }
        }